

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMakeCurrentPerfTests.cpp
# Opt level: O0

int __thiscall deqp::egl::MakeCurrentPerfCase::init(MakeCurrentPerfCase *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  NativeDisplay *nativeDisplay;
  EGLDisplay pvVar1;
  MakeCurrentPerfCase *this_local;
  
  nativeDisplay = EglTestContext::getNativeDisplay((this->super_TestCase).m_eglTestCtx);
  pvVar1 = eglu::getAndInitDisplay(nativeDisplay,(Version *)0x0);
  this->m_display = pvVar1;
  chooseConfig(this);
  createContexts(this);
  createSurfaces(this);
  return extraout_EAX;
}

Assistant:

void MakeCurrentPerfCase::init (void)
{
	m_display = eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay());

	chooseConfig();
	createContexts();
	createSurfaces();
}